

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime.hpp
# Opt level: O0

void __thiscall
toml::local_time::local_time(local_time *this,int h,int m,int s,int ms,int us,int ns)

{
  int us_local;
  int ms_local;
  int s_local;
  int m_local;
  int h_local;
  local_time *this_local;
  
  this->hour = (uint8_t)h;
  this->minute = (uint8_t)m;
  this->second = (uint8_t)s;
  this->millisecond = (uint16_t)ms;
  this->microsecond = (uint16_t)us;
  this->nanosecond = (uint16_t)ns;
  return;
}

Assistant:

local_time(int h, int m, int s,
               int ms = 0, int us = 0, int ns = 0)
        : hour  (static_cast<std::uint8_t>(h)),
          minute(static_cast<std::uint8_t>(m)),
          second(static_cast<std::uint8_t>(s)),
          millisecond(static_cast<std::uint16_t>(ms)),
          microsecond(static_cast<std::uint16_t>(us)),
          nanosecond (static_cast<std::uint16_t>(ns))
    {}